

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> * __thiscall
dgrminer::PartialUnion::createAdjacencyLists
          (vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
           *__return_storage_ptr__,PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          int snapshots)

{
  allocator<int> *this_00;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_01;
  allocator<std::array<int,_8UL>_> *this_02;
  allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *this_03;
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  pointer ppVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_> *this_04;
  undefined1 local_1e0 [8];
  AdjacencyListCrate alc;
  undefined1 local_174 [8];
  array<int,_3UL> node;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adjacencyListNodes;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_148;
  undefined1 local_130 [8];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacencyMoreInfo;
  vector<int,_std::allocator<int>_> local_110;
  undefined1 local_f8 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacencyList;
  ulong uStack_d8;
  int current_snapshot_1;
  size_t n_index;
  size_t e_index;
  pair<int,_int> local_b0;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_a8;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_a0 [3];
  ulong local_88;
  size_t i;
  size_t edges_processed_index;
  vector<int,_std::allocator<int>_> numbers_of_nodes;
  undefined1 local_58 [4];
  int id_counter;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> new_node_ids;
  int current_snapshot;
  int snapshots_local;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges_local;
  PartialUnion *this_local;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  *adjacency_lists;
  
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = snapshots;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_58)
  ;
  numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&edges_processed_index);
  i = 0;
  for (local_88 = 0; uVar3 = local_88,
      sVar6 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                        (&this->nodes), uVar4 = local_88, uVar3 <= sVar6; local_88 = local_88 + 1) {
    sVar6 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                      (&this->nodes);
    if (uVar4 == sVar6) {
LAB_001c5a59:
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&edges_processed_index,
                 (value_type *)
                 ((long)&numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
      while( true ) {
        sVar5 = i;
        sVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                          (&this->edges);
        bVar2 = false;
        if (sVar5 < sVar6) {
          pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                   operator[](&this->edges,i);
          pvVar10 = std::array<int,_8UL>::operator[](pvVar9,0);
          bVar2 = *pvVar10 <= (int)new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        uVar3 = local_88;
        if (!bVar2) break;
        pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](&this->edges,i);
        pvVar10 = std::array<int,_8UL>::operator[](pvVar9,1);
        local_a0[0]._M_node =
             (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_58,pvVar10);
        ppVar11 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(local_a0);
        iVar1 = ppVar11->second;
        pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](&this->edges,i);
        pvVar10 = std::array<int,_8UL>::operator[](pvVar9,1);
        *pvVar10 = iVar1;
        pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](&this->edges,i);
        pvVar10 = std::array<int,_8UL>::operator[](pvVar9,2);
        local_a8._M_node =
             (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_58,pvVar10);
        ppVar11 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_a8);
        iVar1 = ppVar11->second;
        pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](&this->edges,i);
        pvVar10 = std::array<int,_8UL>::operator[](pvVar9,2);
        *pvVar10 = iVar1;
        i = i + 1;
      }
      sVar6 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                        (&this->nodes);
      if (uVar3 == sVar6) break;
      new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._4_4_ = 0;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_58);
    }
    else {
      pvVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (&this->nodes,local_88);
      pvVar8 = std::array<int,_6UL>::operator[](pvVar7,0);
      if ((int)new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count < *pvVar8)
      goto LAB_001c5a59;
    }
    pvVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (&this->nodes,local_88);
    pvVar8 = std::array<int,_6UL>::operator[](pvVar7,1);
    local_b0 = std::make_pair<int&,int&>
                         (pvVar8,(int *)((long)&numbers_of_nodes.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4));
    std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
    insert<std::pair<int,int>>
              ((map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *)local_58,
               &local_b0);
    iVar1 = numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (&this->nodes,local_88);
    pvVar8 = std::array<int,_6UL>::operator[](pvVar7,1);
    *pvVar8 = iVar1;
    numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         numbers_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::vector
            (__return_storage_ptr__);
  new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  n_index = 0;
  uStack_d8 = 0;
  for (adjacencyList.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <=
      new_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           adjacencyList.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&edges_processed_index,
                         (long)(adjacencyList.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1));
    iVar1 = *pvVar12;
    this_00 = (allocator<int> *)
              ((long)&adjacencyMoreInfo.
                      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(this_00);
    std::vector<int,_std::allocator<int>_>::vector(&local_110,0,this_00);
    this_01 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
              ((long)&adjacencyMoreInfo.
                      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
    std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_01);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_f8,(long)iVar1,&local_110,this_01);
    std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)
               ((long)&adjacencyMoreInfo.
                       super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::vector<int,_std::allocator<int>_>::~vector(&local_110);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&adjacencyMoreInfo.
                       super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&edges_processed_index,
                         (long)(adjacencyList.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1));
    iVar1 = *pvVar12;
    this_02 = (allocator<std::array<int,_8UL>_> *)
              ((long)&adjacencyListNodes.
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::array<int,_8UL>_>::allocator(this_02);
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
              (&local_148,0,this_02);
    this_03 = (allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
               *)((long)&adjacencyListNodes.
                         super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
    std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
    allocator(this_03);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              *)local_130,(long)iVar1,&local_148,this_03);
    std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
    ~allocator((allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
                *)((long)&adjacencyListNodes.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector(&local_148);
    std::allocator<std::array<int,_8UL>_>::~allocator
              ((allocator<std::array<int,_8UL>_> *)
               ((long)&adjacencyListNodes.
                       super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
              ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
               (node._M_elems + 1));
    while( true ) {
      sVar6 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                        (&this->nodes);
      bVar2 = false;
      if (uStack_d8 < sVar6) {
        pvVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::
                 operator[](&this->nodes,uStack_d8);
        pvVar8 = std::array<int,_6UL>::operator[](pvVar7,0);
        bVar2 = *pvVar8 <=
                adjacencyList.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      if (!bVar2) break;
      this_04 = &this->nodes;
      pvVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (this_04,uStack_d8);
      pvVar8 = std::array<int,_6UL>::operator[](pvVar7,1);
      local_174._0_4_ = *pvVar8;
      pvVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (this_04,uStack_d8);
      pvVar8 = std::array<int,_6UL>::operator[](pvVar7,4);
      local_174._4_4_ = *pvVar8;
      pvVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (this_04,uStack_d8);
      pvVar8 = std::array<int,_6UL>::operator[](pvVar7,2);
      node._M_elems[0] = *pvVar8;
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::push_back
                ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                 (node._M_elems + 1),(value_type *)local_174);
      uStack_d8 = uStack_d8 + 1;
    }
    while( true ) {
      sVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                        (&this->edges);
      bVar2 = false;
      if (n_index < sVar6) {
        pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](&this->edges,n_index);
        pvVar10 = std::array<int,_8UL>::operator[](pvVar9,0);
        bVar2 = *pvVar10 <=
                adjacencyList.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      if (!bVar2) break;
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,n_index);
      pvVar10 = std::array<int,_8UL>::operator[](pvVar9,1);
      pvVar13 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_f8,(long)*pvVar10);
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,n_index);
      pvVar10 = std::array<int,_8UL>::operator[](pvVar9,2);
      std::vector<int,_std::allocator<int>_>::push_back(pvVar13,pvVar10);
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,n_index);
      pvVar10 = std::array<int,_8UL>::operator[](pvVar9,2);
      pvVar13 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_f8,(long)*pvVar10);
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,n_index);
      pvVar10 = std::array<int,_8UL>::operator[](pvVar9,1);
      std::vector<int,_std::allocator<int>_>::push_back(pvVar13,pvVar10);
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,n_index);
      pvVar10 = std::array<int,_8UL>::operator[](pvVar9,1);
      pvVar14 = std::
                vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                              *)local_130,(long)*pvVar10);
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (newedges,n_index);
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                (pvVar14,pvVar9);
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,n_index);
      pvVar10 = std::array<int,_8UL>::operator[](pvVar9,2);
      pvVar14 = std::
                vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                              *)local_130,(long)*pvVar10);
      pvVar9 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (newedges,n_index);
      flipAdjacencyInfo((array<int,_8UL> *)
                        ((long)&alc.nodes.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pvVar9);
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                (pvVar14,(value_type *)
                         ((long)&alc.nodes.
                                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      n_index = n_index + 1;
    }
    AdjacencyListCrate::AdjacencyListCrate((AdjacencyListCrate *)local_1e0);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_1e0,
                (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_f8);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::operator=((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 *)&alc.adjacencyList.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 *)local_130);
    std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
              ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
               &alc.adjacencyEdgeInfo.
                super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
               (node._M_elems + 1));
    std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
    push_back(__return_storage_ptr__,(value_type *)local_1e0);
    AdjacencyListCrate::~AdjacencyListCrate((AdjacencyListCrate *)local_1e0);
    std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
              ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
               (node._M_elems + 1));
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               *)local_130);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_f8);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&edges_processed_index);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_58)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<AdjacencyListCrate> PartialUnion::createAdjacencyLists(std::vector<std::array<int, 8>> & newedges, int snapshots)
	{
		// RENAME IDS (so IDS are from 0 to N)
		int current_snapshot = 1;  // because first time stamp == 1
		std::map<int, int> new_node_ids;
		int id_counter = 0;

		vector<int> numbers_of_nodes; // how many nodes there are in each snapshot


		size_t edges_processed_index = 0;
		for (size_t i = 0; i <= nodes.size(); i++)
		{

			if (i == nodes.size() || nodes[i][PN_TIME] > current_snapshot)
			{
				// doing next snapshot
				numbers_of_nodes.push_back(id_counter);

				// rename edges
				for (; edges_processed_index < edges.size() && edges[edges_processed_index][PE_TIME] <= current_snapshot; edges_processed_index++)
				{
					edges[edges_processed_index][PE_SRC] = new_node_ids.find(edges[edges_processed_index][PE_SRC])->second;
					edges[edges_processed_index][PE_DST] = new_node_ids.find(edges[edges_processed_index][PE_DST])->second;
				}

				// after all elements are processed, end
				if (i == nodes.size()) break;
				// reset counters:

				current_snapshot++;

				id_counter = 0;
				new_node_ids.clear();

			}

			new_node_ids.insert(std::make_pair(nodes[i][PN_ID], id_counter));

			// rename node ids:
			nodes[i][PN_ID] = id_counter;

			id_counter++;
		}

		// BUILD ADJACENCY LISTS:
		std::vector<AdjacencyListCrate> adjacency_lists;
		current_snapshot = 1;
		size_t e_index = 0;
		size_t n_index = 0;
		for (int current_snapshot = 1; current_snapshot <= snapshots; current_snapshot++)
		{
			// for each snapshot
			// initialize vectors of appropriate sizes:
			std::vector<std::vector<int>> adjacencyList(numbers_of_nodes[current_snapshot - 1], std::vector<int>(0));
			std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacencyMoreInfo(
				numbers_of_nodes[current_snapshot - 1],
				std::vector<std::array<int, ADJ_INFO___SIZE>>(0)
			);
			std::vector<std::array<int, ADJ_NODES___SIZE>> adjacencyListNodes; // NEW

			while (n_index < nodes.size() && nodes[n_index][PN_TIME] <= current_snapshot)
			{
				// fill all nodes in the current snapshot:
				std::array<int, ADJ_NODES___SIZE> node = { nodes[n_index][PN_ID], nodes[n_index][PN_CHANGETIME], nodes[n_index][PN_LABEL] };
				adjacencyListNodes.push_back(node);
				n_index++;
			}
			while (e_index < edges.size() && edges[e_index][PE_TIME] <= current_snapshot)
			{
				// fill all edges of the current snapshot:
				adjacencyList[edges[e_index][PE_SRC]].push_back(edges[e_index][PE_DST]);
				adjacencyList[edges[e_index][PE_DST]].push_back(edges[e_index][PE_SRC]);
				adjacencyMoreInfo[edges[e_index][PE_SRC]].push_back(newedges[e_index]);
				adjacencyMoreInfo[edges[e_index][PE_DST]].push_back(flipAdjacencyInfo(newedges[e_index]));
				e_index++;
			}
			// create new struct element
			AdjacencyListCrate alc;
			alc.adjacencyList = adjacencyList;
			alc.adjacencyEdgeInfo = adjacencyMoreInfo;
			alc.nodes = adjacencyListNodes;
			adjacency_lists.push_back(alc);
		}


		return adjacency_lists;
	}